

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O0

void __thiscall
cppjieba::HMMSegment::Cut
          (HMMSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res)

{
  const_iterator begin_00;
  undefined1 local_48 [8];
  WordRange wr;
  const_iterator right;
  const_iterator left;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res_local;
  const_iterator end_local;
  const_iterator begin_local;
  HMMSegment *this_local;
  
  wr.right = begin;
  right = begin;
  while (wr.right != end) {
    if ((wr.right)->rune < 0x80) {
      if (right != wr.right) {
        InternalCut(this,right,wr.right,res);
      }
      begin_00 = wr.right;
      wr.right = SequentialLetterRule(this,wr.right,end);
      if ((wr.right == begin_00) &&
         (wr.right = NumbersRule(this,begin_00,end), wr.right == begin_00)) {
        wr.right = wr.right + 1;
      }
      WordRange::WordRange((WordRange *)local_48,begin_00,wr.right + -1);
      std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back
                (res,(value_type *)local_48);
      right = wr.right;
    }
    else {
      wr.right = wr.right + 1;
    }
  }
  if (right != wr.right) {
    InternalCut(this,right,wr.right,res);
  }
  return;
}

Assistant:

void Cut(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end, vector<WordRange>& res) const {
    RuneStrArray::const_iterator left = begin;
    RuneStrArray::const_iterator right = begin;
    while (right != end) {
      if (right->rune < 0x80) {
        if (left != right) {
          InternalCut(left, right, res);
        }
        left = right;
        do {
          right = SequentialLetterRule(left, end);
          if (right != left) {
            break;
          }
          right = NumbersRule(left, end);
          if (right != left) {
            break;
          }
          right ++;
        } while (false);
        WordRange wr(left, right - 1);
        res.push_back(wr);
        left = right;
      } else {
        right++;
      }
    }
    if (left != right) {
      InternalCut(left, right, res);
    }
  }